

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

VarSlice * __thiscall kratos::Var::operator[](Var *this,pair<unsigned_int,_unsigned_int> slice)

{
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *this_00;
  uint *puVar1;
  pointer psVar2;
  VarSlice *pVVar3;
  undefined1 auVar4 [8];
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  VarException *pVVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::VarSlice> *s;
  pointer psVar12;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  Var *local_b0;
  VarSlice *local_a8;
  uint local_a0 [2];
  pair<unsigned_int,_unsigned_int> local_98;
  Var *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  VarSlice *local_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::PackedSlice> packed_slice;
  undefined1 local_58 [8];
  shared_ptr<kratos::VarSlice> var_slice;
  undefined1 local_31;
  
  uVar7 = slice.first;
  local_98 = slice;
  if (uVar7 < slice.second) {
    pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)slice & 0xffffffff);
    format_str_00.size_ = 0x22;
    format_str_00.data_ = (char *)0x25;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    local_58 = (undefined1  [8])((ulong)slice >> 0x20);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_78,(detail *)"low ({0}) cannot be larger than ({1})",format_str_00,
               args_00);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_90;
    local_90 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58,
               __l_00,(allocator_type *)&local_80);
    VarException::VarException
              (pVVar10,(string *)local_78,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58);
    __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = *puVar1;
  if (uVar6 == 1 &&
      (long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 4) {
    uVar6 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
    if (uVar6 <= uVar7) {
      pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
      uVar7 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
      local_58 = (undefined1  [8])((ulong)local_98 & 0xffffffff);
      var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar7;
      format_str.size_ = 0x22;
      format_str.data_ = (char *)0x2d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_78,(detail *)"high ({0}) has to be smaller than width ({1})",
                 format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_90;
      local_90 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                 ,__l,(allocator_type *)&local_80);
      VarException::VarException
                (pVVar10,(string *)local_78,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                );
      __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (uVar6 <= uVar7) {
    pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
    local_58 = (undefined1  [8])((ulong)slice & 0xffffffff);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)*(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    format_str_01.size_ = 0x22;
    format_str_01.data_ = (char *)0x2c;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_78,(detail *)"high ({0}) has to be smaller than size ({1})",
               format_str_01,args_01);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_90;
    local_90 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58,
               __l_01,(allocator_type *)&local_80);
    VarException::VarException
              (pVVar10,(string *)local_78,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58);
    __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar12 = (this->slices_).
            super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = (VarSlice *)this;
  while( true ) {
    pVVar3 = local_a8;
    if (psVar12 == psVar2) {
      local_78 = (undefined1  [8])local_a8;
      std::__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<kratos::VarSlice>,kratos::Var*,unsigned_int_const&,unsigned_int_const&>
                ((__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2> *)local_58,
                 (allocator<kratos::VarSlice> *)&local_90,(Var **)local_78,&local_98.first,
                 &local_98.second);
      if ((pVVar3->super_Var).width_param_ != (Var *)0x0) {
        (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[0x23])();
      }
      iVar8 = (*(pVVar3->super_Var).super_IRNode._vptr_IRNode[0x29])(pVVar3);
      cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0xb8))
                        ((long *)CONCAT44(extraout_var,iVar8));
      this_00 = &(pVVar3->super_Var).slices_;
      if ((cVar5 == '\0') ||
         (uVar9 = (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[7])(),
         uVar9 != ((Var *)local_58)->var_width_)) {
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)this_00,(shared_ptr<kratos::VarSlice> *)local_58);
      }
      else {
        iVar8 = (*(pVVar3->super_Var).super_IRNode._vptr_IRNode[0x29])(pVVar3);
        if (CONCAT44(extraout_var_00,iVar8) == 0) {
          plVar11 = (long *)0x0;
        }
        else {
          plVar11 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar8),&typeinfo,
                                           &PackedInterface::typeinfo,0xfffffffffffffffe);
        }
        local_80 = (VarSlice *)local_58;
        iVar8 = (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[7])();
        local_a0[0] = iVar8 - 1;
        local_a0[1] = 0;
        (**(code **)(*plVar11 + 0x10))(&local_90,plVar11);
        local_b0 = local_90;
        std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<kratos::PackedSlice>,kratos::VarSlice*,unsigned_int,int,kratos::PackedStruct*>
                  ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)local_78,
                   (allocator<kratos::PackedSlice> *)&local_31,&local_80,local_a0,
                   (int *)(local_a0 + 1),(PackedStruct **)&local_b0);
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)this_00,(shared_ptr<kratos::PackedSlice> *)local_78);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)((long)local_78 + 0x188),(shared_ptr<kratos::VarSlice> *)local_58);
        local_58 = local_78;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_slice);
        if (packed_slice.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     packed_slice.
                     super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      auVar4 = local_58;
      if (var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
      }
      return (VarSlice *)auVar4;
    }
    iVar8 = (*(((psVar12->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((((char)iVar8 == '\0') &&
        (pVVar3 = (psVar12->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        , pVVar3->high == uVar7)) && (pVVar3->low == slice.second)) break;
    psVar12 = psVar12 + 1;
  }
  return pVVar3;
}

Assistant:

VarSlice &Var::operator[](std::pair<uint32_t, uint32_t> slice) {
    auto const [high, low] = slice;
    if (low > high) {
        throw VarException(::format("low ({0}) cannot be larger than ({1})", low, high), {this});
    }
    // if the size is not 1, we are slicing off size, not width
    if (size_.size() == 1 && size_.front() == 1) {
        if (high >= width()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than width ({1})", high, width()), {this});
        }
    } else {
        if (high >= size_.front()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than size ({1})", high, size_.front()),
                {this});
        }
    }
    // if there is one already
    for (auto const &s : slices_) {
        if (!s->sliced_by_var()) {
            if (high == s->high && low == s->low) return *s;
        }
    }
    // create a new one
    // notice that slice is not part of generator's variables. It's handled by the parent (var)
    // itself
    std::shared_ptr<VarSlice> var_slice = ::make_shared<VarSlice>(this, high, low);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    // depends on the root variable, if it is actually a struct, we need to return to the
    // actual trampoline class as proxy
    if (get_var_root_parent()->is_struct() && var_slice->width() == var_slice->var_width()) {
        // we actually reached the real struct
        auto *s = dynamic_cast<PackedInterface *>(get_var_root_parent());
        auto packed_slice = std::make_shared<PackedSlice>(var_slice.get(), var_slice->width() - 1,
                                                          0, s->packed_struct().get());
        slices_.emplace_back(packed_slice);
        // this is a hack here, but we store the parent into the child
        packed_slice->slices_.emplace_back(var_slice);
        var_slice = packed_slice;
    } else {
        slices_.emplace_back(var_slice);
    }

    return *var_slice;
}